

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O2

int tcu::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  ChannelType channelType;
  ChannelType channelType_00;
  int iVar1;
  int iVar2;
  int iVar3;
  TextureChannelClass TVar4;
  TextureChannelClass TVar5;
  int extraout_EAX;
  void *pvVar6;
  void *pvVar7;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong uVar8;
  ulong extraout_RAX_01;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int y;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int x;
  int iVar15;
  uint x_00;
  int x_2;
  uint uVar16;
  int y_1;
  uint y_00;
  uint uVar17;
  float depth;
  
  uVar11 = *(uint *)(dst + 8);
  uVar16 = *(uint *)(dst + 0xc);
  uVar12 = *(uint *)(dst + 0x10);
  iVar1 = TextureFormat::getPixelSize((TextureFormat *)src);
  iVar2 = TextureFormat::getPixelSize((TextureFormat *)dst);
  iVar15 = *(int *)src;
  channelType = *(ChannelType *)(src + 4);
  iVar3 = *(int *)dst;
  channelType_00 = *(ChannelType *)(dst + 4);
  if (((iVar1 != *(int *)(src + 0x14)) || (iVar2 != *(int *)(dst + 0x14))) ||
     (channelType != channelType_00 || iVar15 != iVar3)) {
    if (channelType != channelType_00 || iVar15 != iVar3) {
      if (iVar15 - 0x12U < 3 || iVar3 - 0x12U < 3) {
        uVar14 = iVar3 - 0x13;
        if ((iVar15 - 0x12U & 0xfffffffd) == 0 && (iVar3 - 0x12U & 0xfffffffd) == 0) {
          uVar13 = 0;
          uVar17 = 0;
          if (0 < (int)uVar11) {
            uVar17 = uVar11;
          }
          uVar10 = 0;
          if (0 < (int)uVar16) {
            uVar10 = uVar16;
          }
          uVar9 = 0;
          if (0 < (int)uVar12) {
            uVar9 = uVar12;
          }
          for (; uVar13 != uVar9; uVar13 = uVar13 + 1) {
            for (y_00 = 0; y_00 != uVar10; y_00 = y_00 + 1) {
              for (x_00 = 0; uVar17 != x_00; x_00 = x_00 + 1) {
                depth = ConstPixelBufferAccess::getPixDepth
                                  ((ConstPixelBufferAccess *)src,x_00,y_00,uVar13);
                PixelBufferAccess::setPixDepth((PixelBufferAccess *)dst,depth,x_00,y_00,uVar13);
              }
            }
          }
        }
        else if (((iVar3 == 0x14) || (iVar3 == 0x12)) && ((iVar15 != 0x12 && (iVar15 != 0x14)))) {
          clearDepth((PixelBufferAccess *)dst,0.0);
        }
        if ((iVar15 - 0x13U | uVar14) < 2) {
          uVar14 = 0;
          if ((int)uVar11 < 1) {
            uVar11 = uVar14;
          }
          if ((int)uVar16 < 1) {
            uVar16 = uVar14;
          }
          if ((int)uVar12 < 1) {
            uVar12 = uVar14;
          }
          uVar8 = (ulong)uVar12;
          for (; iVar3 = (int)uVar8, uVar14 != uVar12; uVar14 = uVar14 + 1) {
            for (uVar17 = 0; uVar17 != uVar16; uVar17 = uVar17 + 1) {
              for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
                iVar15 = ConstPixelBufferAccess::getPixStencil
                                   ((ConstPixelBufferAccess *)src,uVar13,uVar17,uVar14);
                PixelBufferAccess::setPixStencil
                          ((PixelBufferAccess *)dst,iVar15,uVar13,uVar17,uVar14);
                uVar8 = extraout_RAX_01;
              }
            }
          }
        }
        else {
          iVar3 = CONCAT31((int3)(uVar14 >> 8),1 < uVar14);
          if (iVar15 - 0x15U < 0xfffffffe && 1 >= uVar14) {
            clearStencil((PixelBufferAccess *)dst,0);
            return extraout_EAX;
          }
        }
      }
      else {
        TVar4 = getTextureChannelClass(channelType);
        TVar5 = getTextureChannelClass(channelType_00);
        uVar8 = (ulong)TVar5;
        uVar14 = 0;
        if ((int)uVar11 < 1) {
          uVar11 = uVar14;
        }
        if ((int)uVar16 < 1) {
          uVar16 = uVar14;
        }
        if ((int)uVar12 < 1) {
          uVar12 = uVar14;
        }
        if (((TVar4 & ~TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) ==
             TEXTURECHANNELCLASS_SIGNED_INTEGER) &&
           (uVar8 = (ulong)(TVar5 & ~TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT),
           (TVar5 & ~TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) == TEXTURECHANNELCLASS_SIGNED_INTEGER
           )) {
          for (uVar14 = 0; iVar3 = (int)uVar8, uVar14 != uVar12; uVar14 = uVar14 + 1) {
            for (uVar17 = 0; uVar17 != uVar16; uVar17 = uVar17 + 1) {
              for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
                ConstPixelBufferAccess::getPixelInt
                          ((ConstPixelBufferAccess *)&stack0xffffffffffffffc0,(int)src,uVar13,uVar17
                          );
                PixelBufferAccess::setPixel
                          ((PixelBufferAccess *)dst,(IVec4 *)&stack0xffffffffffffffc0,uVar13,uVar17,
                           uVar14);
                uVar8 = extraout_RAX;
              }
            }
          }
        }
        else {
          for (; iVar3 = (int)uVar8, uVar14 != uVar12; uVar14 = uVar14 + 1) {
            for (uVar17 = 0; uVar17 != uVar16; uVar17 = uVar17 + 1) {
              for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
                ConstPixelBufferAccess::getPixel
                          ((ConstPixelBufferAccess *)&stack0xffffffffffffffc0,(int)src,uVar13,uVar17
                          );
                PixelBufferAccess::setPixel
                          ((PixelBufferAccess *)dst,(Vec4 *)&stack0xffffffffffffffc0,uVar13,uVar17,
                           uVar14);
                uVar8 = extraout_RAX_00;
              }
            }
          }
        }
      }
    }
    else {
      pvVar6 = (void *)0x0;
      if ((int)uVar11 < 1) {
        uVar11 = 0;
      }
      if ((int)uVar16 < 1) {
        uVar16 = 0;
      }
      pvVar7 = (void *)(ulong)uVar12;
      if ((int)uVar12 < 1) {
        pvVar7 = pvVar6;
      }
      iVar15 = (int)pvVar7;
      while( true ) {
        iVar3 = (int)pvVar7;
        iVar2 = (int)pvVar6;
        if (iVar2 == iVar15) break;
        for (uVar12 = 0; uVar12 != uVar16; uVar12 = uVar12 + 1) {
          for (uVar14 = 0; uVar11 != uVar14; uVar14 = uVar14 + 1) {
            pvVar7 = memcpy((void *)((long)(*(int *)(dst + 0x1c) * iVar2) +
                                     (long)(int)(*(int *)(dst + 0x18) * uVar12) +
                                    (long)(int)(*(int *)(dst + 0x14) * uVar14) +
                                    *(long *)(dst + 0x20)),
                            (void *)((long)(*(int *)(src + 0x1c) * iVar2) +
                                     (long)(int)(*(int *)(src + 0x18) * uVar12) +
                                    (long)(int)(*(int *)(src + 0x14) * uVar14) +
                                    *(long *)(src + 0x20)),(long)iVar1);
          }
        }
        pvVar6 = (void *)(ulong)(iVar2 + 1);
      }
    }
  }
  else {
    iVar15 = 0;
    if ((int)uVar16 < 1) {
      uVar16 = 0;
    }
    pvVar6 = (void *)(ulong)uVar12;
    if ((int)uVar12 < 1) {
      pvVar6 = (void *)0x0;
    }
    iVar2 = (int)pvVar6;
    for (; iVar3 = (int)pvVar6, iVar15 != iVar2; iVar15 = iVar15 + 1) {
      for (uVar12 = 0; uVar16 != uVar12; uVar12 = uVar12 + 1) {
        pvVar6 = memcpy((void *)((long)(*(int *)(dst + 0x1c) * iVar15) +
                                (long)(int)(*(int *)(dst + 0x18) * uVar12) + *(long *)(dst + 0x20)),
                        (void *)((long)(*(int *)(src + 0x1c) * iVar15) +
                                (long)(int)(*(int *)(src + 0x18) * uVar12) + *(long *)(src + 0x20)),
                        (long)(int)(iVar1 * uVar11));
      }
    }
  }
  return iVar3;
}

Assistant:

void copy (const PixelBufferAccess& dst, const ConstPixelBufferAccess& src)
{
	DE_ASSERT(src.getSize() == dst.getSize());

	const int	width				= dst.getWidth();
	const int	height				= dst.getHeight();
	const int	depth				= dst.getDepth();

	const int	srcPixelSize		= src.getFormat().getPixelSize();
	const int	dstPixelSize		= dst.getFormat().getPixelSize();
	const int	srcPixelPitch		= src.getPixelPitch();
	const int	dstPixelPitch		= dst.getPixelPitch();
	const bool	srcTightlyPacked	= (srcPixelSize == srcPixelPitch);
	const bool	dstTightlyPacked	= (dstPixelSize == dstPixelPitch);

	const bool	srcHasDepth			= (src.getFormat().order == tcu::TextureFormat::DS || src.getFormat().order == tcu::TextureFormat::D);
	const bool	srcHasStencil		= (src.getFormat().order == tcu::TextureFormat::DS || src.getFormat().order == tcu::TextureFormat::S);
	const bool	dstHasDepth			= (dst.getFormat().order == tcu::TextureFormat::DS || dst.getFormat().order == tcu::TextureFormat::D);
	const bool	dstHasStencil		= (dst.getFormat().order == tcu::TextureFormat::DS || dst.getFormat().order == tcu::TextureFormat::S);

	if (src.getFormat() == dst.getFormat() && srcTightlyPacked && dstTightlyPacked)
	{
		// Fast-path for matching formats.
		for (int z = 0; z < depth; z++)
		for (int y = 0; y < height; y++)
			deMemcpy(dst.getPixelPtr(0, y, z), src.getPixelPtr(0, y, z), srcPixelSize*width);
	}
	else if (src.getFormat() == dst.getFormat())
	{
		// Bit-exact copy for matching formats.
		for (int z = 0; z < depth; z++)
		for (int y = 0; y < height; y++)
		for (int x = 0; x < width; x++)
			deMemcpy(dst.getPixelPtr(x, y, z), src.getPixelPtr(x, y, z), srcPixelSize);
	}
	else if (srcHasDepth || srcHasStencil || dstHasDepth || dstHasStencil)
	{
		DE_ASSERT((srcHasDepth && dstHasDepth) || (srcHasStencil && dstHasStencil)); // must have at least one common channel

		if (dstHasDepth && srcHasDepth)
		{
			for (int z = 0; z < depth; z++)
			for (int y = 0; y < height; y++)
			for (int x = 0; x < width; x++)
				dst.setPixDepth(src.getPixDepth(x, y, z), x, y, z);
		}
		else if (dstHasDepth && !srcHasDepth)
		{
			// consistency with color copies
			tcu::clearDepth(dst, 0.0f);
		}

		if (dstHasStencil && srcHasStencil)
		{
			for (int z = 0; z < depth; z++)
			for (int y = 0; y < height; y++)
			for (int x = 0; x < width; x++)
				dst.setPixStencil(src.getPixStencil(x, y, z), x, y, z);
		}
		else if (dstHasStencil && !srcHasStencil)
		{
			// consistency with color copies
			tcu::clearStencil(dst, 0u);
		}
	}
	else
	{
		TextureChannelClass		srcClass	= getTextureChannelClass(src.getFormat().type);
		TextureChannelClass		dstClass	= getTextureChannelClass(dst.getFormat().type);
		bool					srcIsInt	= srcClass == TEXTURECHANNELCLASS_SIGNED_INTEGER || srcClass == TEXTURECHANNELCLASS_UNSIGNED_INTEGER;
		bool					dstIsInt	= dstClass == TEXTURECHANNELCLASS_SIGNED_INTEGER || dstClass == TEXTURECHANNELCLASS_UNSIGNED_INTEGER;

		if (srcIsInt && dstIsInt)
		{
			for (int z = 0; z < depth; z++)
			for (int y = 0; y < height; y++)
			for (int x = 0; x < width; x++)
				dst.setPixel(src.getPixelInt(x, y, z), x, y, z);
		}
		else
		{
			for (int z = 0; z < depth; z++)
			for (int y = 0; y < height; y++)
			for (int x = 0; x < width; x++)
				dst.setPixel(src.getPixel(x, y, z), x, y, z);
		}
	}
}